

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse2::
     BVHNIntersector1<4,_16777232,_true,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMiMBIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  undefined8 *puVar24;
  float *pfVar25;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar26;
  int iVar27;
  Geometry *pGVar28;
  long lVar29;
  long lVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  undefined1 (*pauVar35) [16];
  int iVar36;
  undefined4 uVar37;
  float *vertices;
  undefined1 (*pauVar38) [16];
  RayHit *pRVar40;
  AABBNodeMB4D *node1;
  ulong uVar41;
  RTCRayQueryContext *pRVar42;
  ulong uVar43;
  ulong uVar44;
  RayHit *pRVar45;
  ulong uVar46;
  ulong uVar47;
  undefined8 uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  float fVar67;
  float fVar74;
  float fVar75;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar93;
  float fVar96;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar94;
  float fVar95;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar92 [16];
  float fVar100;
  float fVar110;
  float fVar112;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar111;
  float fVar113;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar114;
  float fVar118;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar123;
  float fVar124;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar125;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar142 [16];
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  UVIdentity<4> mapUV;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1279;
  undefined1 local_1278 [8];
  float fStack_1270;
  float fStack_126c;
  undefined1 local_1268 [12];
  float fStack_125c;
  undefined1 local_1258 [16];
  ulong local_1248;
  ulong local_1240;
  RayHit *local_1238;
  RayQueryContext *local_1230;
  undefined1 local_1228 [16];
  undefined1 local_120c [8];
  float fStack_1204;
  undefined4 uStack_1200;
  undefined1 auStack_11fc [4];
  undefined1 local_11f8 [12];
  float fStack_11ec;
  RTCFilterFunctionNArguments local_11e8;
  undefined8 local_11b8;
  float fStack_11b0;
  float fStack_11ac;
  undefined8 local_11a8;
  float fStack_11a0;
  float fStack_119c;
  undefined1 local_1198 [8];
  float fStack_1190;
  float fStack_118c;
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  float local_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  float local_1168;
  float fStack_1164;
  float fStack_1160;
  float fStack_115c;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  long local_1140;
  long local_1138;
  Scene *local_1130;
  float local_1128;
  float local_1124;
  float local_1120;
  undefined4 local_111c;
  undefined4 local_1118;
  undefined4 local_1114;
  uint local_1110;
  uint local_110c;
  uint local_1108;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined1 local_10c8 [12];
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  undefined1 local_10a8 [16];
  undefined1 *local_1098;
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  float local_1058 [4];
  float local_1048 [4];
  float local_1038 [4];
  float local_1028 [4];
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  uint local_fa8;
  uint uStack_fa4;
  uint uStack_fa0;
  uint uStack_f9c;
  undefined1 local_f98 [8];
  float fStack_f90;
  float fStack_f8c;
  undefined8 local_f88;
  undefined8 uStack_f80;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  ulong uVar39;
  undefined1 auVar131 [16];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar38 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar125 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar155 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar149 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar74 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    aVar26 = (ray->super_RayK<1>).dir.field_0.field_1;
    fVar67 = 0.0;
    if (0.0 <= fVar74) {
      fVar67 = fVar74;
    }
    fVar74 = (ray->super_RayK<1>).tfar;
    fVar75 = 0.0;
    if (0.0 <= fVar74) {
      fVar75 = fVar74;
    }
    uVar55 = -(uint)(1e-18 <= ABS(aVar26.x));
    uVar56 = -(uint)(1e-18 <= ABS(aVar26.y));
    uVar60 = -(uint)(1e-18 <= ABS(aVar26.z));
    auVar101 = divps(_DAT_01f7ba10,(undefined1  [16])aVar26);
    fVar140 = (float)(~uVar55 & 0x5d5e0b6b | auVar101._0_4_ & uVar55);
    fVar143 = (float)(~uVar56 & 0x5d5e0b6b | auVar101._4_4_ & uVar56);
    fVar145 = (float)(~uVar60 & 0x5d5e0b6b | auVar101._8_4_ & uVar60);
    fVar148 = fVar140 * 0.99999964;
    fVar151 = fVar143 * 0.99999964;
    fVar153 = fVar145 * 0.99999964;
    fVar140 = fVar140 * 1.0000004;
    fVar143 = fVar143 * 1.0000004;
    fVar145 = fVar145 * 1.0000004;
    local_f98._4_4_ = fVar143;
    local_f98._0_4_ = fVar143;
    fStack_f90 = fVar143;
    fStack_f8c = fVar143;
    uVar39 = (ulong)(fVar148 < 0.0) << 4;
    uVar50 = (ulong)(fVar151 < 0.0) << 4 | 0x20;
    uVar54 = (ulong)(fVar153 < 0.0) << 4 | 0x40;
    uVar52 = uVar39 ^ 0x10;
    uVar53 = uVar50 ^ 0x10;
    auVar101._4_4_ = fVar67;
    auVar101._0_4_ = fVar67;
    auVar101._8_4_ = fVar67;
    auVar101._12_4_ = fVar67;
    auVar132._4_4_ = fVar75;
    auVar132._0_4_ = fVar75;
    auVar132._8_4_ = fVar75;
    auVar132._12_4_ = fVar75;
    _local_fa8 = mm_lookupmask_ps._240_8_;
    _uStack_fa0 = mm_lookupmask_ps._248_8_;
    local_fb8 = fVar149;
    fStack_fb4 = fVar149;
    fStack_fb0 = fVar149;
    fStack_fac = fVar149;
    local_fc8 = auVar101;
    local_fd8 = fVar145;
    fStack_fd4 = fVar145;
    fStack_fd0 = fVar145;
    fStack_fcc = fVar145;
    local_fe8 = fVar153;
    fStack_fe4 = fVar153;
    fStack_fe0 = fVar153;
    fStack_fdc = fVar153;
    local_ff8 = fVar125;
    fStack_ff4 = fVar125;
    fStack_ff0 = fVar125;
    fStack_fec = fVar125;
    local_1008 = fVar155;
    fStack_1004 = fVar155;
    fStack_1000 = fVar155;
    fStack_ffc = fVar155;
    local_1018 = fVar148;
    fStack_1014 = fVar148;
    fStack_1010 = fVar148;
    fStack_100c = fVar148;
    local_10e8 = fVar151;
    fStack_10e4 = fVar151;
    fStack_10e0 = fVar151;
    fStack_10dc = fVar151;
    local_10f8 = fVar140;
    fStack_10f4 = fVar140;
    fStack_10f0 = fVar140;
    fStack_10ec = fVar140;
    fVar67 = fVar151;
    fVar75 = fVar151;
    fVar143 = fVar151;
    fVar79 = fVar140;
    fVar85 = fVar140;
    fVar86 = fVar140;
    local_1230 = context;
    local_1238 = ray;
    local_1240 = uVar50;
    local_1248 = uVar39;
    fVar126 = fVar153;
    fVar124 = fVar153;
    fVar123 = fVar153;
    fVar118 = fVar145;
    fVar114 = fVar145;
    fVar113 = fVar145;
    fVar112 = fVar149;
    fVar111 = fVar149;
    fVar110 = fVar149;
    fVar100 = fVar148;
    fVar99 = fVar148;
    fVar98 = fVar148;
    fVar97 = fVar155;
    fVar96 = fVar155;
    fVar95 = fVar155;
    fVar94 = fVar125;
    fVar93 = fVar125;
    fVar87 = fVar125;
    pRVar45 = ray;
LAB_00d0a787:
    do {
      pauVar35 = pauVar38 + -1;
      pauVar38 = pauVar38 + -1;
      if (*(float *)((long)*pauVar35 + 8) <= fVar74) {
        uVar43 = *(ulong *)*pauVar38;
        while ((uVar43 & 8) == 0) {
          fVar127 = (pRVar45->super_RayK<1>).dir.field_0.m128[3];
          fVar74 = (pRVar45->super_RayK<1>).tfar;
          uVar41 = uVar43 & 0xfffffffffffffff0;
          pfVar25 = (float *)(uVar41 + 0x80 + uVar39);
          pfVar23 = (float *)(uVar41 + 0x20 + uVar39);
          auVar88._0_4_ = ((*pfVar25 * fVar127 + *pfVar23) - fVar87) * fVar98;
          auVar88._4_4_ = ((pfVar25[1] * fVar127 + pfVar23[1]) - fVar93) * fVar99;
          auVar88._8_4_ = ((pfVar25[2] * fVar127 + pfVar23[2]) - fVar94) * fVar100;
          auVar88._12_4_ = ((pfVar25[3] * fVar127 + pfVar23[3]) - fVar125) * fVar148;
          auVar88 = maxps(auVar101,auVar88);
          pfVar25 = (float *)(uVar41 + 0x80 + uVar50);
          pfVar23 = (float *)(uVar41 + 0x20 + uVar50);
          auVar102._0_4_ = ((*pfVar25 * fVar127 + *pfVar23) - fVar95) * fVar151;
          auVar102._4_4_ = ((pfVar25[1] * fVar127 + pfVar23[1]) - fVar96) * fVar67;
          auVar102._8_4_ = ((pfVar25[2] * fVar127 + pfVar23[2]) - fVar97) * fVar75;
          auVar102._12_4_ = ((pfVar25[3] * fVar127 + pfVar23[3]) - fVar155) * fVar143;
          pfVar25 = (float *)(uVar41 + 0x80 + uVar54);
          pfVar23 = (float *)(uVar41 + 0x20 + uVar54);
          auVar106._0_4_ = ((*pfVar25 * fVar127 + *pfVar23) - fVar110) * fVar123;
          auVar106._4_4_ = ((pfVar25[1] * fVar127 + pfVar23[1]) - fVar111) * fVar124;
          auVar106._8_4_ = ((pfVar25[2] * fVar127 + pfVar23[2]) - fVar112) * fVar126;
          auVar106._12_4_ = ((pfVar25[3] * fVar127 + pfVar23[3]) - fVar149) * fVar153;
          auVar102 = maxps(auVar102,auVar106);
          _local_10c8 = maxps(auVar88,auVar102);
          pfVar25 = (float *)(uVar41 + 0x80 + uVar52);
          pfVar23 = (float *)(uVar41 + 0x20 + uVar52);
          auVar116._0_4_ = ((*pfVar25 * fVar127 + *pfVar23) - fVar87) * fVar140;
          auVar116._4_4_ = ((pfVar25[1] * fVar127 + pfVar23[1]) - fVar93) * fVar79;
          auVar116._8_4_ = ((pfVar25[2] * fVar127 + pfVar23[2]) - fVar94) * fVar85;
          auVar116._12_4_ = ((pfVar25[3] * fVar127 + pfVar23[3]) - fVar125) * fVar86;
          pfVar25 = (float *)(uVar41 + 0x80 + uVar53);
          pfVar23 = (float *)(uVar41 + 0x20 + uVar53);
          auVar120._0_4_ = ((*pfVar25 * fVar127 + *pfVar23) - fVar95) * (float)local_f98._0_4_;
          auVar120._4_4_ = ((pfVar25[1] * fVar127 + pfVar23[1]) - fVar96) * (float)local_f98._4_4_;
          auVar120._8_4_ = ((pfVar25[2] * fVar127 + pfVar23[2]) - fVar97) * fStack_f90;
          auVar120._12_4_ = ((pfVar25[3] * fVar127 + pfVar23[3]) - fVar155) * fStack_f8c;
          pfVar25 = (float *)(uVar41 + 0x80 + (uVar54 ^ 0x10));
          pfVar23 = (float *)(uVar41 + 0x20 + (uVar54 ^ 0x10));
          auVar90._0_4_ = ((*pfVar25 * fVar127 + *pfVar23) - fVar110) * fVar113;
          auVar90._4_4_ = ((pfVar25[1] * fVar127 + pfVar23[1]) - fVar111) * fVar114;
          auVar90._8_4_ = ((pfVar25[2] * fVar127 + pfVar23[2]) - fVar112) * fVar118;
          auVar90._12_4_ = ((pfVar25[3] * fVar127 + pfVar23[3]) - fVar149) * fVar145;
          auVar102 = minps(auVar120,auVar90);
          auVar88 = minps(auVar132,auVar116);
          auVar88 = minps(auVar88,auVar102);
          if (((uint)uVar43 & 7) == 6) {
            bVar31 = (fVar127 < *(float *)(uVar41 + 0xf0) && *(float *)(uVar41 + 0xe0) <= fVar127)
                     && local_10c8._0_4_ <= auVar88._0_4_;
            bVar32 = (fVar127 < *(float *)(uVar41 + 0xf4) && *(float *)(uVar41 + 0xe4) <= fVar127)
                     && local_10c8._4_4_ <= auVar88._4_4_;
            bVar33 = (fVar127 < *(float *)(uVar41 + 0xf8) && *(float *)(uVar41 + 0xe8) <= fVar127)
                     && local_10c8._8_4_ <= auVar88._8_4_;
            bVar34 = (fVar127 < *(float *)(uVar41 + 0xfc) && *(float *)(uVar41 + 0xec) <= fVar127)
                     && local_10c8._12_4_ <= auVar88._12_4_;
          }
          else {
            bVar31 = local_10c8._0_4_ <= auVar88._0_4_;
            bVar32 = local_10c8._4_4_ <= auVar88._4_4_;
            bVar33 = local_10c8._8_4_ <= auVar88._8_4_;
            bVar34 = local_10c8._12_4_ <= auVar88._12_4_;
          }
          auVar80._0_4_ = (uint)bVar31 * -0x80000000;
          auVar80._4_4_ = (uint)bVar32 * -0x80000000;
          auVar80._8_4_ = (uint)bVar33 * -0x80000000;
          auVar80._12_4_ = (uint)bVar34 * -0x80000000;
          uVar55 = movmskps((int)ray,auVar80);
          ray = (RayHit *)(ulong)uVar55;
          if (uVar55 == 0) {
            if (pauVar38 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            goto LAB_00d0a787;
          }
          ray = (RayHit *)(ulong)(byte)uVar55;
          lVar30 = 0;
          if (ray != (RayHit *)0x0) {
            for (; ((byte)uVar55 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
            }
          }
          uVar43 = *(ulong *)(uVar41 + lVar30 * 8);
          uVar55 = (uVar55 & 0xff) - 1 & uVar55 & 0xff;
          if (uVar55 != 0) {
            uVar56 = *(uint *)(local_10c8 + lVar30 * 4);
            ray = (RayHit *)(ulong)uVar56;
            lVar30 = 0;
            if (uVar55 != 0) {
              for (; (uVar55 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
              }
            }
            uVar44 = *(ulong *)(uVar41 + lVar30 * 8);
            uVar60 = *(uint *)(local_10c8 + lVar30 * 4);
            uVar55 = uVar55 - 1 & uVar55;
            uVar39 = local_1248;
            uVar50 = local_1240;
            if (uVar55 == 0) {
              if (uVar56 < uVar60) {
                *(ulong *)*pauVar38 = uVar44;
                *(uint *)((long)*pauVar38 + 8) = uVar60;
                pauVar38 = pauVar38 + 1;
              }
              else {
                *(ulong *)*pauVar38 = uVar43;
                *(uint *)((long)*pauVar38 + 8) = uVar56;
                pauVar38 = pauVar38 + 1;
                uVar43 = uVar44;
              }
            }
            else {
              auVar76._8_4_ = uVar56;
              auVar76._0_8_ = uVar43;
              auVar76._12_4_ = 0;
              auVar81._8_4_ = uVar60;
              auVar81._0_8_ = uVar44;
              auVar81._12_4_ = 0;
              lVar30 = 0;
              if (uVar55 != 0) {
                for (; (uVar55 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                }
              }
              uVar43 = *(ulong *)(uVar41 + lVar30 * 8);
              iVar36 = *(int *)(local_10c8 + lVar30 * 4);
              auVar89._8_4_ = iVar36;
              auVar89._0_8_ = uVar43;
              auVar89._12_4_ = 0;
              auVar103._8_4_ = -(uint)((int)uVar56 < (int)uVar60);
              uVar55 = uVar55 - 1 & uVar55;
              if (uVar55 == 0) {
                auVar103._4_4_ = auVar103._8_4_;
                auVar103._0_4_ = auVar103._8_4_;
                auVar103._12_4_ = auVar103._8_4_;
                auVar88 = auVar76 & auVar103 | ~auVar103 & auVar81;
                auVar102 = auVar81 & auVar103 | ~auVar103 & auVar76;
                auVar104._8_4_ = -(uint)(auVar88._8_4_ < iVar36);
                auVar104._0_8_ = CONCAT44(auVar104._8_4_,auVar104._8_4_);
                auVar104._12_4_ = auVar104._8_4_;
                auVar90 = auVar89 & auVar104 | ~auVar104 & auVar88;
                auVar77._8_4_ = -(uint)(auVar102._8_4_ < auVar90._8_4_);
                auVar77._4_4_ = auVar77._8_4_;
                auVar77._0_4_ = auVar77._8_4_;
                auVar77._12_4_ = auVar77._8_4_;
                *pauVar38 = ~auVar77 & auVar102 | auVar90 & auVar77;
                pauVar38[1] = auVar102 & auVar77 | ~auVar77 & auVar90;
                pauVar38 = pauVar38 + 2;
                uVar43 = ~auVar104._0_8_ & uVar43 | auVar88._0_8_ & auVar104._0_8_;
                ray = (RayHit *)(ulong)uVar55;
              }
              else {
                ray = (RayHit *)0x0;
                if ((RayHit *)(ulong)uVar55 != (RayHit *)0x0) {
                  for (; (uVar55 >> (long)ray & 1) == 0;
                      ray = (RayHit *)((long)(ray->super_RayK<1>).org.field_0.m128 + 1)) {
                  }
                }
                iVar27 = *(int *)(local_10c8 + (long)ray * 4);
                auVar115._8_4_ = iVar27;
                auVar115._0_8_ = *(undefined8 *)(uVar41 + (long)ray * 8);
                auVar115._12_4_ = 0;
                auVar105._4_4_ = auVar103._8_4_;
                auVar105._0_4_ = auVar103._8_4_;
                auVar105._8_4_ = auVar103._8_4_;
                auVar105._12_4_ = auVar103._8_4_;
                auVar88 = auVar76 & auVar105 | ~auVar105 & auVar81;
                auVar102 = auVar81 & auVar105 | ~auVar105 & auVar76;
                auVar119._0_4_ = -(uint)(iVar36 < iVar27);
                auVar119._4_4_ = -(uint)(iVar36 < iVar27);
                auVar119._8_4_ = -(uint)(iVar36 < iVar27);
                auVar119._12_4_ = -(uint)(iVar36 < iVar27);
                auVar106 = auVar89 & auVar119 | ~auVar119 & auVar115;
                auVar120 = ~auVar119 & auVar89 | auVar115 & auVar119;
                auVar91._8_4_ = -(uint)(auVar102._8_4_ < auVar120._8_4_);
                auVar91._4_4_ = auVar91._8_4_;
                auVar91._0_4_ = auVar91._8_4_;
                auVar91._12_4_ = auVar91._8_4_;
                auVar116 = auVar102 & auVar91 | ~auVar91 & auVar120;
                auVar82._8_4_ = -(uint)(auVar88._8_4_ < auVar106._8_4_);
                auVar82._0_8_ = CONCAT44(auVar82._8_4_,auVar82._8_4_);
                auVar82._12_4_ = auVar82._8_4_;
                auVar90 = ~auVar82 & auVar88 | auVar106 & auVar82;
                auVar78._8_4_ = -(uint)(auVar90._8_4_ < auVar116._8_4_);
                auVar78._4_4_ = auVar78._8_4_;
                auVar78._0_4_ = auVar78._8_4_;
                auVar78._12_4_ = auVar78._8_4_;
                *pauVar38 = ~auVar91 & auVar102 | auVar120 & auVar91;
                pauVar38[1] = ~auVar78 & auVar90 | auVar116 & auVar78;
                pauVar38[2] = auVar90 & auVar78 | ~auVar78 & auVar116;
                pauVar38 = pauVar38 + 3;
                uVar43 = auVar88._0_8_ & auVar82._0_8_ | ~auVar82._0_8_ & auVar106._0_8_;
                fVar151 = local_10e8;
                fVar67 = fStack_10e4;
                fVar75 = fStack_10e0;
                fVar143 = fStack_10dc;
                fVar140 = local_10f8;
                fVar79 = fStack_10f4;
                fVar85 = fStack_10f0;
                fVar86 = fStack_10ec;
              }
            }
          }
        }
        local_1140 = (ulong)((uint)uVar43 & 0xf) - 8;
        if (local_1140 != 0) {
          uVar43 = uVar43 & 0xfffffffffffffff0;
          local_1138 = 0;
          do {
            local_1228._0_8_ = local_1138 * 0x50;
            local_1130 = local_1230->scene;
            pGVar28 = (local_1130->geometries).items[*(uint *)(uVar43 + 0x30 + local_1138 * 0x50)].
                      ptr;
            local_1268._0_4_ = pGVar28->fnumTimeSegments;
            fVar67 = (pGVar28->time_range).lower;
            fVar67 = (((pRVar45->super_RayK<1>).dir.field_0.m128[3] - fVar67) /
                     ((pGVar28->time_range).upper - fVar67)) * pGVar28->fnumTimeSegments;
            _local_1278 = ZEXT416((uint)fVar67);
            local_1258._0_8_ = pGVar28;
            fVar67 = floorf(fVar67);
            if ((float)local_1268._0_4_ + -1.0 <= fVar67) {
              fVar67 = (float)local_1268._0_4_ + -1.0;
            }
            fVar125 = 0.0;
            if (0.0 <= fVar67) {
              fVar125 = fVar67;
            }
            uVar51 = (ulong)*(uint *)(uVar43 + 4 + local_1228._0_8_);
            lVar30 = *(long *)(*(long *)&((Geometry *)(local_1258._0_8_ + 0xc0))->numPrimitives +
                              (long)(int)fVar125 * 0x38);
            lVar29 = *(long *)(*(long *)&((Geometry *)(local_1258._0_8_ + 0xc0))->numPrimitives +
                               0x38 + (long)(int)fVar125 * 0x38);
            pfVar23 = (float *)(lVar30 + (ulong)*(uint *)(uVar43 + local_1228._0_8_) * 4);
            ray = (RayHit *)(ulong)*(uint *)(uVar43 + 0x10 + local_1228._0_8_);
            pfVar25 = (float *)(lVar30 + (long)ray * 4);
            uVar50 = (ulong)*(uint *)(uVar43 + 0x20 + local_1228._0_8_);
            pfVar1 = (float *)(lVar30 + uVar50 * 4);
            pfVar2 = (float *)(lVar30 + uVar51 * 4);
            uVar39 = (ulong)*(uint *)(uVar43 + 0x14 + local_1228._0_8_);
            pfVar3 = (float *)(lVar30 + uVar39 * 4);
            uVar41 = (ulong)*(uint *)(uVar43 + 0x24 + local_1228._0_8_);
            pfVar4 = (float *)(lVar30 + uVar41 * 4);
            uVar44 = (ulong)*(uint *)(uVar43 + 8 + local_1228._0_8_);
            pfVar5 = (float *)(lVar30 + uVar44 * 4);
            local_11b8 = (ulong)*(uint *)(uVar43 + 0x18 + local_1228._0_8_);
            pfVar6 = (float *)(lVar30 + local_11b8 * 4);
            uVar46 = (ulong)*(uint *)(uVar43 + 0x28 + local_1228._0_8_);
            pfVar7 = (float *)(lVar30 + uVar46 * 4);
            uVar47 = (ulong)*(uint *)(uVar43 + 0xc + local_1228._0_8_);
            pfVar8 = (float *)(lVar30 + uVar47 * 4);
            local_11a8 = (ulong)*(uint *)(uVar43 + 0x1c + local_1228._0_8_);
            pfVar9 = (float *)(lVar30 + local_11a8 * 4);
            uVar49 = (ulong)*(uint *)(uVar43 + 0x2c + local_1228._0_8_);
            pfVar10 = (float *)(lVar30 + uVar49 * 4);
            pfVar11 = (float *)(lVar29 + (ulong)*(uint *)(uVar43 + local_1228._0_8_) * 4);
            pfVar12 = (float *)(lVar29 + (long)ray * 4);
            local_1278._0_4_ = (float)local_1278._0_4_ - fVar125;
            pfVar13 = (float *)(lVar29 + uVar51 * 4);
            local_11f8._4_4_ = pfVar8[2];
            local_11f8._0_4_ = pfVar5[2];
            pfVar14 = (float *)(lVar29 + uVar44 * 4);
            pfVar15 = (float *)(lVar29 + uVar47 * 4);
            local_1198._4_4_ = pfVar4[2];
            local_1198._0_4_ = pfVar1[2];
            fStack_1190 = pfVar7[2];
            fStack_118c = pfVar10[2];
            pfVar16 = (float *)(lVar29 + local_11b8 * 4);
            pfVar17 = (float *)(lVar29 + uVar39 * 4);
            pfVar18 = (float *)(lVar29 + local_11a8 * 4);
            pfVar19 = (float *)(lVar29 + uVar50 * 4);
            pfVar20 = (float *)(lVar29 + uVar46 * 4);
            pfVar21 = (float *)(lVar29 + uVar41 * 4);
            pfVar22 = (float *)(lVar29 + uVar49 * 4);
            fVar149 = 1.0 - (float)local_1278._0_4_;
            puVar24 = (undefined8 *)(uVar43 + 0x30 + local_1228._0_8_);
            local_f88 = *puVar24;
            uStack_f80 = puVar24[1];
            puVar24 = (undefined8 *)(uVar43 + 0x40 + local_1228._0_8_);
            local_10d8 = *puVar24;
            uStack_10d0 = puVar24[1];
            fVar67 = (local_1238->super_RayK<1>).org.field_0.m128[0];
            fVar125 = (local_1238->super_RayK<1>).org.field_0.m128[1];
            fVar155 = (local_1238->super_RayK<1>).org.field_0.m128[2];
            fVar85 = (*pfVar23 * fVar149 + *pfVar11 * (float)local_1278._0_4_) - fVar67;
            fVar93 = (*pfVar2 * fVar149 + *pfVar13 * (float)local_1278._0_4_) - fVar67;
            fVar96 = (*pfVar5 * fVar149 + *pfVar14 * (float)local_1278._0_4_) - fVar67;
            fVar98 = (*pfVar8 * fVar149 + *pfVar15 * (float)local_1278._0_4_) - fVar67;
            fVar138 = (pfVar23[1] * fVar149 + pfVar11[1] * (float)local_1278._0_4_) - fVar125;
            fVar139 = (pfVar2[1] * fVar149 + pfVar13[1] * (float)local_1278._0_4_) - fVar125;
            fStack_1150 = (pfVar5[1] * fVar149 + pfVar14[1] * (float)local_1278._0_4_) - fVar125;
            fStack_114c = (pfVar8[1] * fVar149 + pfVar15[1] * (float)local_1278._0_4_) - fVar125;
            local_120c._4_4_ =
                 (pfVar23[2] * fVar149 + pfVar11[2] * (float)local_1278._0_4_) - fVar155;
            fStack_1204 = (pfVar2[2] * fVar149 + pfVar13[2] * (float)local_1278._0_4_) - fVar155;
            uStack_1200 = ((float)uStack_1200 * fVar149 + pfVar14[2] * (float)local_1278._0_4_) -
                          fVar155;
            auStack_11fc = (undefined1  [4])
                           (((float)auStack_11fc * fVar149 + pfVar15[2] * (float)local_1278._0_4_) -
                           fVar155);
            fVar100 = (*pfVar25 * fVar149 + *pfVar12 * (float)local_1278._0_4_) - fVar67;
            fVar110 = (*pfVar3 * fVar149 + *pfVar17 * (float)local_1278._0_4_) - fVar67;
            fVar112 = ((float)local_1268._8_4_ * fVar149 + *pfVar16 * (float)local_1278._0_4_) -
                      fVar67;
            fVar113 = (fStack_125c * fVar149 + *pfVar18 * (float)local_1278._0_4_) - fVar67;
            fVar129 = (pfVar25[1] * fVar149 + pfVar12[1] * (float)local_1278._0_4_) - fVar125;
            fVar134 = (pfVar3[1] * fVar149 + pfVar17[1] * (float)local_1278._0_4_) - fVar125;
            fVar136 = (pfVar6[1] * fVar149 + pfVar16[1] * (float)local_1278._0_4_) - fVar125;
            fVar137 = (pfVar9[1] * fVar149 + pfVar18[1] * (float)local_1278._0_4_) - fVar125;
            fVar159 = (*pfVar6 * fVar149 + pfVar12[2] * (float)local_1278._0_4_) - fVar155;
            fVar161 = (*pfVar9 * fVar149 + pfVar17[2] * (float)local_1278._0_4_) - fVar155;
            fVar163 = (pfVar6[2] * fVar149 + pfVar16[2] * (float)local_1278._0_4_) - fVar155;
            fVar165 = (pfVar9[2] * fVar149 + pfVar18[2] * (float)local_1278._0_4_) - fVar155;
            fVar156 = (*pfVar1 * fVar149 + *pfVar19 * (float)local_1278._0_4_) - fVar67;
            fVar157 = (*pfVar4 * fVar149 + *pfVar21 * (float)local_1278._0_4_) - fVar67;
            fVar158 = (*pfVar7 * fVar149 + *pfVar20 * (float)local_1278._0_4_) - fVar67;
            fVar67 = (*pfVar10 * fVar149 + *pfVar22 * (float)local_1278._0_4_) - fVar67;
            fVar145 = (pfVar1[1] * fVar149 + pfVar19[1] * (float)local_1278._0_4_) - fVar125;
            fVar123 = (pfVar4[1] * fVar149 + pfVar21[1] * (float)local_1278._0_4_) - fVar125;
            fVar124 = (pfVar7[1] * fVar149 + pfVar20[1] * (float)local_1278._0_4_) - fVar125;
            fVar125 = (pfVar10[1] * fVar149 + pfVar22[1] * (float)local_1278._0_4_) - fVar125;
            fVar150 = (fVar149 * pfVar1[2] + (float)local_1278._0_4_ * pfVar19[2]) - fVar155;
            fVar152 = (fVar149 * pfVar4[2] + (float)local_1278._0_4_ * pfVar21[2]) - fVar155;
            fVar154 = (fVar149 * pfVar7[2] + (float)local_1278._0_4_ * pfVar20[2]) - fVar155;
            fVar155 = (fVar149 * pfVar10[2] + (float)local_1278._0_4_ * pfVar22[2]) - fVar155;
            fVar148 = fVar156 - fVar85;
            fVar111 = fVar157 - fVar93;
            fStack_1160 = fVar158 - fVar96;
            fStack_115c = fVar67 - fVar98;
            fVar114 = fVar145 - fVar138;
            fVar118 = fVar123 - fVar139;
            fStack_1180 = fVar124 - fStack_1150;
            fStack_117c = fVar125 - fStack_114c;
            fVar86 = fVar150 - (float)local_120c._4_4_;
            fVar94 = fVar152 - fStack_1204;
            fStack_1170 = fVar154 - (float)uStack_1200;
            fStack_116c = fVar155 - (float)auStack_11fc;
            _local_1178 = CONCAT44(fVar94,fVar86);
            _local_1188 = CONCAT44(fVar118,fVar114);
            _local_1168 = CONCAT44(fVar111,fVar148);
            fVar149 = (local_1238->super_RayK<1>).dir.field_0.m128[0];
            fVar74 = (local_1238->super_RayK<1>).dir.field_0.m128[1];
            fVar75 = (local_1238->super_RayK<1>).dir.field_0.m128[2];
            local_1258._4_4_ = fVar75;
            local_1258._0_4_ = fVar75;
            local_1258._8_4_ = fVar75;
            local_1258._12_4_ = fVar75;
            fVar130 = (fVar114 * (fVar150 + (float)local_120c._4_4_) - fVar86 * (fVar145 + fVar138))
                      * fVar149 +
                      (fVar86 * (fVar156 + fVar85) - (fVar150 + (float)local_120c._4_4_) * fVar148)
                      * fVar74 +
                      ((fVar145 + fVar138) * fVar148 - (fVar156 + fVar85) * fVar114) * fVar75;
            fVar135 = (fVar118 * (fVar152 + fStack_1204) - fVar94 * (fVar123 + fVar139)) * fVar149 +
                      (fVar94 * (fVar157 + fVar93) - (fVar152 + fStack_1204) * fVar111) * fVar74 +
                      ((fVar123 + fVar139) * fVar111 - (fVar157 + fVar93) * fVar118) * fVar75;
            auVar131._0_8_ = CONCAT44(fVar135,fVar130);
            auVar131._8_4_ =
                 (fStack_1180 * (fVar154 + (float)uStack_1200) -
                 fStack_1170 * (fVar124 + fStack_1150)) * fVar149 +
                 (fStack_1170 * (fVar158 + fVar96) - (fVar154 + (float)uStack_1200) * fStack_1160) *
                 fVar74 + ((fVar124 + fStack_1150) * fStack_1160 - (fVar158 + fVar96) * fStack_1180)
                          * fVar75;
            auVar131._12_4_ =
                 (fStack_117c * (fVar155 + (float)auStack_11fc) -
                 fStack_116c * (fVar125 + fStack_114c)) * fVar149 +
                 (fStack_116c * (fVar67 + fVar98) - (fVar155 + (float)auStack_11fc) * fStack_115c) *
                 fVar74 + ((fVar125 + fStack_114c) * fStack_115c - (fVar67 + fVar98) * fStack_117c)
                          * fVar75;
            fVar126 = fVar138 - fVar129;
            fVar153 = fVar139 - fVar134;
            fVar127 = fStack_1150 - fVar136;
            fVar128 = fStack_114c - fVar137;
            fVar141 = (float)local_120c._4_4_ - fVar159;
            fVar144 = fStack_1204 - fVar161;
            fVar146 = (float)uStack_1200 - fVar163;
            fVar147 = (float)auStack_11fc - fVar165;
            _local_1158 = CONCAT44(fVar139,fVar138);
            fVar167 = fVar85 - fVar100;
            fVar168 = fVar93 - fVar110;
            fVar169 = fVar96 - fVar112;
            fVar170 = fVar98 - fVar113;
            local_1268._0_4_ =
                 (fVar126 * ((float)local_120c._4_4_ + fVar159) - fVar141 * (fVar138 + fVar129)) *
                 fVar149 + (fVar141 * (fVar85 + fVar100) -
                           ((float)local_120c._4_4_ + fVar159) * fVar167) * fVar74 +
                           ((fVar138 + fVar129) * fVar167 - (fVar85 + fVar100) * fVar126) * fVar75;
            local_1268._4_4_ =
                 (fVar153 * (fStack_1204 + fVar161) - fVar144 * (fVar139 + fVar134)) * fVar149 +
                 (fVar144 * (fVar93 + fVar110) - (fStack_1204 + fVar161) * fVar168) * fVar74 +
                 ((fVar139 + fVar134) * fVar168 - (fVar93 + fVar110) * fVar153) * fVar75;
            local_1268._8_4_ =
                 (fVar127 * ((float)uStack_1200 + fVar163) - fVar146 * (fStack_1150 + fVar136)) *
                 fVar149 + (fVar146 * (fVar96 + fVar112) - ((float)uStack_1200 + fVar163) * fVar169)
                           * fVar74 +
                           ((fStack_1150 + fVar136) * fVar169 - (fVar96 + fVar112) * fVar127) *
                           fVar75;
            fStack_125c = (fVar128 * ((float)auStack_11fc + fVar165) -
                          fVar147 * (fStack_114c + fVar137)) * fVar149 +
                          (fVar147 * (fVar98 + fVar113) - ((float)auStack_11fc + fVar165) * fVar170)
                          * fVar74 +
                          ((fStack_114c + fVar137) * fVar170 - (fVar98 + fVar113) * fVar128) *
                          fVar75;
            fVar151 = fVar100 - fVar156;
            fVar143 = fVar110 - fVar157;
            fVar140 = fVar112 - fVar158;
            fVar79 = fVar113 - fVar67;
            fVar160 = fVar129 - fVar145;
            fVar162 = fVar134 - fVar123;
            fVar164 = fVar136 - fVar124;
            fVar166 = fVar137 - fVar125;
            fVar87 = fVar159 - fVar150;
            fVar95 = fVar161 - fVar152;
            fVar97 = fVar163 - fVar154;
            fVar99 = fVar165 - fVar155;
            auVar68._0_4_ =
                 (fVar160 * (fVar150 + fVar159) - fVar87 * (fVar145 + fVar129)) * fVar149 +
                 (fVar87 * (fVar156 + fVar100) - (fVar150 + fVar159) * fVar151) * fVar74 +
                 ((fVar145 + fVar129) * fVar151 - (fVar156 + fVar100) * fVar160) * fVar75;
            auVar68._4_4_ =
                 (fVar162 * (fVar152 + fVar161) - fVar95 * (fVar123 + fVar134)) * fVar149 +
                 (fVar95 * (fVar157 + fVar110) - (fVar152 + fVar161) * fVar143) * fVar74 +
                 ((fVar123 + fVar134) * fVar143 - (fVar157 + fVar110) * fVar162) * fVar75;
            auVar68._8_4_ =
                 (fVar164 * (fVar154 + fVar163) - fVar97 * (fVar124 + fVar136)) * fVar149 +
                 (fVar97 * (fVar158 + fVar112) - (fVar154 + fVar163) * fVar140) * fVar74 +
                 ((fVar124 + fVar136) * fVar140 - (fVar158 + fVar112) * fVar164) * fVar75;
            auVar68._12_4_ =
                 (fVar166 * (fVar155 + fVar165) - fVar99 * (fVar125 + fVar137)) * fVar149 +
                 (fVar99 * (fVar67 + fVar113) - (fVar155 + fVar165) * fVar79) * fVar74 +
                 ((fVar125 + fVar137) * fVar79 - (fVar67 + fVar113) * fVar166) * fVar75;
            auVar121._0_4_ = fVar130 + (float)local_1268._0_4_ + auVar68._0_4_;
            auVar121._4_4_ = fVar135 + local_1268._4_4_ + auVar68._4_4_;
            auVar121._8_4_ = auVar131._8_4_ + (float)local_1268._8_4_ + auVar68._8_4_;
            auVar121._12_4_ = auVar131._12_4_ + fStack_125c + auVar68._12_4_;
            auVar83._8_4_ = auVar131._8_4_;
            auVar83._0_8_ = auVar131._0_8_;
            auVar83._12_4_ = auVar131._12_4_;
            auVar101 = minps(auVar83,_local_1268);
            auVar101 = minps(auVar101,auVar68);
            auVar132 = maxps(auVar131,_local_1268);
            auVar132 = maxps(auVar132,auVar68);
            fVar67 = ABS(auVar121._0_4_);
            fVar125 = ABS(auVar121._4_4_);
            fVar155 = ABS(auVar121._8_4_);
            fVar100 = ABS(auVar121._12_4_);
            local_1279 = 0;
            auVar133._0_4_ =
                 -(uint)(auVar132._0_4_ <= fVar67 * 1.1920929e-07 ||
                        -(fVar67 * 1.1920929e-07) <= auVar101._0_4_) & local_fa8;
            auVar133._4_4_ =
                 -(uint)(auVar132._4_4_ <= fVar125 * 1.1920929e-07 ||
                        -(fVar125 * 1.1920929e-07) <= auVar101._4_4_) & uStack_fa4;
            auVar133._8_4_ =
                 -(uint)(auVar132._8_4_ <= fVar155 * 1.1920929e-07 ||
                        -(fVar155 * 1.1920929e-07) <= auVar101._8_4_) & uStack_fa0;
            auVar133._12_4_ =
                 -(uint)(auVar132._12_4_ <= fVar100 * 1.1920929e-07 ||
                        -(fVar100 * 1.1920929e-07) <= auVar101._12_4_) & uStack_f9c;
            iVar36 = movmskps(local_1228._0_4_,auVar133);
            local_1228 = auVar131;
            if (iVar36 != 0) {
              _local_1198 = auVar121;
              local_11a8 = CONCAT44(fVar125,fVar67);
              fStack_11a0 = fVar155;
              fStack_119c = fVar100;
              local_11b8 = CONCAT44(fVar162,fVar160);
              fStack_11b0 = fVar164;
              fStack_11ac = fVar166;
              uVar55 = -(uint)(ABS(fVar141 * fVar160) <= ABS(fVar86 * fVar126));
              uVar57 = -(uint)(ABS(fVar144 * fVar162) <= ABS(fVar94 * fVar153));
              uVar61 = -(uint)(ABS(fVar146 * fVar164) <= ABS(fStack_1170 * fVar127));
              uVar64 = -(uint)(ABS(fVar147 * fVar166) <= ABS(fStack_116c * fVar128));
              uVar56 = -(uint)(ABS(fVar167 * fVar87) <= ABS(fVar148 * fVar141));
              uVar58 = -(uint)(ABS(fVar168 * fVar95) <= ABS(fVar111 * fVar144));
              uVar62 = -(uint)(ABS(fVar169 * fVar97) <= ABS(fStack_1160 * fVar146));
              uVar65 = -(uint)(ABS(fVar170 * fVar99) <= ABS(fStack_115c * fVar147));
              uVar60 = -(uint)(ABS(fVar126 * fVar151) <= ABS(fVar114 * fVar167));
              uVar59 = -(uint)(ABS(fVar153 * fVar143) <= ABS(fVar118 * fVar168));
              uVar63 = -(uint)(ABS(fVar127 * fVar140) <= ABS(fStack_1180 * fVar169));
              uVar66 = -(uint)(ABS(fVar128 * fVar79) <= ABS(fStack_117c * fVar170));
              fVar110 = (float)(~uVar55 & (uint)(fVar114 * fVar141 - fVar86 * fVar126) |
                               (uint)(fVar126 * fVar87 - fVar141 * fVar160) & uVar55);
              fVar112 = (float)(~uVar57 & (uint)(fVar118 * fVar144 - fVar94 * fVar153) |
                               (uint)(fVar153 * fVar95 - fVar144 * fVar162) & uVar57);
              fVar113 = (float)(~uVar61 & (uint)(fStack_1180 * fVar146 - fStack_1170 * fVar127) |
                               (uint)(fVar127 * fVar97 - fVar146 * fVar164) & uVar61);
              fVar145 = (float)(~uVar64 & (uint)(fStack_117c * fVar147 - fStack_116c * fVar128) |
                               (uint)(fVar128 * fVar99 - fVar147 * fVar166) & uVar64);
              fVar86 = (float)(~uVar56 & (uint)(fVar86 * fVar167 - fVar148 * fVar141) |
                              (uint)(fVar141 * fVar151 - fVar167 * fVar87) & uVar56);
              fVar87 = (float)(~uVar58 & (uint)(fVar94 * fVar168 - fVar111 * fVar144) |
                              (uint)(fVar144 * fVar143 - fVar168 * fVar95) & uVar58);
              fVar94 = (float)(~uVar62 & (uint)(fStack_1170 * fVar169 - fStack_1160 * fVar146) |
                              (uint)(fVar146 * fVar140 - fVar169 * fVar97) & uVar62);
              fVar95 = (float)(~uVar65 & (uint)(fStack_116c * fVar170 - fStack_115c * fVar147) |
                              (uint)(fVar147 * fVar79 - fVar170 * fVar99) & uVar65);
              fVar97 = (float)(~uVar60 & (uint)(fVar148 * fVar126 - fVar114 * fVar167) |
                              (uint)(fVar167 * fVar160 - fVar126 * fVar151) & uVar60);
              fVar99 = (float)(~uVar59 & (uint)(fVar111 * fVar153 - fVar118 * fVar168) |
                              (uint)(fVar168 * fVar162 - fVar153 * fVar143) & uVar59);
              fVar148 = (float)(~uVar63 & (uint)(fStack_1160 * fVar127 - fStack_1180 * fVar169) |
                               (uint)(fVar169 * fVar164 - fVar127 * fVar140) & uVar63);
              fVar111 = (float)(~uVar66 & (uint)(fStack_115c * fVar128 - fStack_117c * fVar170) |
                               (uint)(fVar170 * fVar166 - fVar128 * fVar79) & uVar66);
              fVar151 = fVar149 * fVar110 + fVar74 * fVar86 + fVar75 * fVar97;
              fVar143 = fVar149 * fVar112 + fVar74 * fVar87 + fVar75 * fVar99;
              fVar140 = fVar149 * fVar113 + fVar74 * fVar94 + fVar75 * fVar148;
              fVar149 = fVar149 * fVar145 + fVar74 * fVar95 + fVar75 * fVar111;
              auVar107._0_4_ = fVar151 + fVar151;
              auVar107._4_4_ = fVar143 + fVar143;
              auVar107._8_4_ = fVar140 + fVar140;
              auVar107._12_4_ = fVar149 + fVar149;
              auVar69._0_4_ = (float)local_120c._4_4_ * fVar97;
              auVar69._4_4_ = fStack_1204 * fVar99;
              auVar69._8_4_ = (float)uStack_1200 * fVar148;
              auVar69._12_4_ = (float)auStack_11fc * fVar111;
              fVar143 = fVar85 * fVar110 + fVar138 * fVar86 + auVar69._0_4_;
              fVar140 = fVar93 * fVar112 + fVar139 * fVar87 + auVar69._4_4_;
              fVar79 = fVar96 * fVar113 + fStack_1150 * fVar94 + auVar69._8_4_;
              fVar85 = fVar98 * fVar145 + fStack_114c * fVar95 + auVar69._12_4_;
              auVar101 = rcpps(auVar69,auVar107);
              fVar149 = auVar101._0_4_;
              fVar74 = auVar101._4_4_;
              fVar75 = auVar101._8_4_;
              fVar151 = auVar101._12_4_;
              local_1278._0_4_ =
                   ((1.0 - auVar107._0_4_ * fVar149) * fVar149 + fVar149) * (fVar143 + fVar143);
              local_1278._4_4_ =
                   ((1.0 - auVar107._4_4_ * fVar74) * fVar74 + fVar74) * (fVar140 + fVar140);
              fStack_1270 = ((1.0 - auVar107._8_4_ * fVar75) * fVar75 + fVar75) * (fVar79 + fVar79);
              fStack_126c = ((1.0 - auVar107._12_4_ * fVar151) * fVar151 + fVar151) *
                            (fVar85 + fVar85);
              auVar122._0_4_ = (local_1238->super_RayK<1>).tfar;
              auVar122._4_4_ = (local_1238->super_RayK<1>).mask;
              auVar122._8_4_ = (local_1238->super_RayK<1>).id;
              auVar122._12_4_ = (local_1238->super_RayK<1>).flags;
              fVar149 = (local_1238->super_RayK<1>).org.field_0.m128[3];
              auVar70._4_4_ = -(uint)(fVar149 <= (float)local_1278._4_4_);
              auVar70._0_4_ = -(uint)(fVar149 <= (float)local_1278._0_4_);
              auVar70._8_4_ = -(uint)(fVar149 <= fStack_1270);
              auVar70._12_4_ = -(uint)(fVar149 <= fStack_126c);
              auVar108._0_4_ =
                   (int)((uint)(auVar107._0_4_ != 0.0 &&
                               ((float)local_1278._0_4_ <= (float)auVar122._0_4_ &&
                               fVar149 <= (float)local_1278._0_4_)) * -0x80000000) >> 0x1f;
              auVar108._4_4_ =
                   (int)((uint)(auVar107._4_4_ != 0.0 &&
                               ((float)local_1278._4_4_ <= (float)auVar122._0_4_ &&
                               fVar149 <= (float)local_1278._4_4_)) * -0x80000000) >> 0x1f;
              auVar108._8_4_ =
                   (int)((uint)(auVar107._8_4_ != 0.0 &&
                               (fStack_1270 <= (float)auVar122._0_4_ && fVar149 <= fStack_1270)) *
                        -0x80000000) >> 0x1f;
              auVar108._12_4_ =
                   (int)((uint)(auVar107._12_4_ != 0.0 &&
                               (fStack_126c <= (float)auVar122._0_4_ && fVar149 <= fStack_126c)) *
                        -0x80000000) >> 0x1f;
              auVar109 = auVar108 & auVar133;
              iVar36 = movmskps(iVar36,auVar109);
              if (iVar36 != 0) {
                local_10c8._8_4_ = auVar131._8_4_;
                local_10c8._0_8_ = auVar131._0_8_;
                fStack_10bc = auVar131._12_4_;
                local_10b8 = (float)local_1268._0_4_;
                fStack_10b4 = local_1268._4_4_;
                fStack_10b0 = (float)local_1268._8_4_;
                fStack_10ac = fStack_125c;
                local_10a8 = auVar121;
                local_1098 = &local_1279;
                local_1088 = auVar109;
                local_1058[0] = (float)local_1278._0_4_;
                local_1058[1] = (float)local_1278._4_4_;
                local_1058[2] = fStack_1270;
                local_1058[3] = fStack_126c;
                local_1048[0] = fVar110;
                local_1048[1] = fVar112;
                local_1048[2] = fVar113;
                local_1048[3] = fVar145;
                local_1038[0] = fVar86;
                local_1038[1] = fVar87;
                local_1038[2] = fVar94;
                local_1038[3] = fVar95;
                local_1028[0] = fVar97;
                local_1028[1] = fVar99;
                local_1028[2] = fVar148;
                local_1028[3] = fVar111;
                _local_11f8 = auVar109;
                auVar101 = rcpps(auVar70,auVar121);
                fVar149 = auVar101._0_4_;
                fVar74 = auVar101._4_4_;
                fVar75 = auVar101._8_4_;
                fVar151 = auVar101._12_4_;
                fVar67 = (float)(-(uint)(1e-18 <= fVar67) &
                                (uint)(((float)DAT_01f7ba10 - auVar121._0_4_ * fVar149) * fVar149 +
                                      fVar149));
                fVar125 = (float)(-(uint)(1e-18 <= fVar125) &
                                 (uint)((DAT_01f7ba10._4_4_ - auVar121._4_4_ * fVar74) * fVar74 +
                                       fVar74));
                fVar155 = (float)(-(uint)(1e-18 <= fVar155) &
                                 (uint)((DAT_01f7ba10._8_4_ - auVar121._8_4_ * fVar75) * fVar75 +
                                       fVar75));
                fVar149 = (float)(-(uint)(1e-18 <= fVar100) &
                                 (uint)((DAT_01f7ba10._12_4_ - auVar121._12_4_ * fVar151) * fVar151
                                       + fVar151));
                auVar117._0_4_ = fVar130 * fVar67;
                auVar117._4_4_ = fVar135 * fVar125;
                auVar117._8_4_ = auVar131._8_4_ * fVar155;
                auVar117._12_4_ = auVar131._12_4_ * fVar149;
                local_1078 = minps(auVar117,_DAT_01f7ba10);
                auVar142._0_4_ = fVar67 * (float)local_1268._0_4_;
                auVar142._4_4_ = fVar125 * local_1268._4_4_;
                auVar142._8_4_ = fVar155 * (float)local_1268._8_4_;
                auVar142._12_4_ = fVar149 * fStack_125c;
                local_1068 = minps(auVar142,_DAT_01f7ba10);
                uVar55 = auVar109._0_4_;
                uVar56 = auVar109._4_4_;
                uVar60 = auVar109._8_4_;
                uVar57 = auVar109._12_4_;
                auVar71._0_4_ = uVar55 & local_1278._0_4_;
                auVar71._4_4_ = uVar56 & local_1278._4_4_;
                auVar71._8_4_ = uVar60 & (uint)fStack_1270;
                auVar71._12_4_ = uVar57 & (uint)fStack_126c;
                auVar92._0_8_ = CONCAT44(~uVar56,~uVar55) & 0x7f8000007f800000;
                auVar92._8_4_ = ~uVar60 & 0x7f800000;
                auVar92._12_4_ = ~uVar57 & 0x7f800000;
                auVar92 = auVar92 | auVar71;
                auVar84._4_4_ = auVar92._0_4_;
                auVar84._0_4_ = auVar92._4_4_;
                auVar84._8_4_ = auVar92._12_4_;
                auVar84._12_4_ = auVar92._8_4_;
                auVar101 = minps(auVar84,auVar92);
                auVar72._0_8_ = auVar101._8_8_;
                auVar72._8_4_ = auVar101._0_4_;
                auVar72._12_4_ = auVar101._4_4_;
                auVar101 = minps(auVar72,auVar101);
                auVar73._0_8_ =
                     CONCAT44(-(uint)(auVar101._4_4_ == auVar92._4_4_) & uVar56,
                              -(uint)(auVar101._0_4_ == auVar92._0_4_) & uVar55);
                auVar73._8_4_ = -(uint)(auVar101._8_4_ == auVar92._8_4_) & uVar60;
                auVar73._12_4_ = -(uint)(auVar101._12_4_ == auVar92._12_4_) & uVar57;
                iVar36 = movmskps((int)&local_1279,auVar73);
                if (iVar36 != 0) {
                  auVar109._8_4_ = auVar73._8_4_;
                  auVar109._0_8_ = auVar73._0_8_;
                  auVar109._12_4_ = auVar73._12_4_;
                }
                uVar37 = movmskps(iVar36,auVar109);
                uVar39 = CONCAT44((int)((ulong)&local_1279 >> 0x20),uVar37);
                pRVar45 = (RayHit *)0x0;
                uVar55 = auVar122._4_4_;
                if (uVar39 != 0) {
                  for (; (uVar39 >> (long)pRVar45 & 1) == 0;
                      pRVar45 = (RayHit *)((long)(pRVar45->super_RayK<1>).org.field_0.m128 + 1)) {
                  }
                }
                do {
                  uVar56 = *(uint *)((long)&local_f88 + (long)pRVar45 * 4);
                  pGVar28 = (local_1130->geometries).items[uVar56].ptr;
                  if ((pGVar28->mask & uVar55) == 0) {
                    *(undefined4 *)(local_11f8 + (long)pRVar45 * 4) = 0;
                  }
                  else {
                    uVar48 = local_1230->args;
                    if (((RTCIntersectArguments *)uVar48)->filter == (RTCFilterFunctionN)0x0) {
                      pRVar42 = local_1230->user;
                      if (pGVar28->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar67 = *(float *)(local_1078 + (long)pRVar45 * 4);
                        fVar125 = *(float *)(local_1068 + (long)pRVar45 * 4);
                        (local_1238->super_RayK<1>).tfar = local_1058[(long)pRVar45];
                        (local_1238->Ng).field_0.field_0.x = local_1048[(long)pRVar45];
                        (local_1238->Ng).field_0.field_0.y = local_1038[(long)pRVar45];
                        (local_1238->Ng).field_0.field_0.z = local_1028[(long)pRVar45];
                        local_1238->u = fVar67;
                        local_1238->v = fVar125;
                        uVar55 = *(uint *)((long)&local_10d8 + (long)pRVar45 * 4);
                        ray = (RayHit *)(ulong)uVar55;
                        local_1238->primID = uVar55;
                        local_1238->geomID = uVar56;
                        local_1238->instID[0] = pRVar42->instID[0];
                        local_1238->instPrimID[0] = pRVar42->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      pRVar42 = local_1230->user;
                    }
                    local_1128 = local_1048[(long)pRVar45];
                    local_1124 = local_1038[(long)pRVar45];
                    local_1120 = local_1028[(long)pRVar45];
                    local_111c = *(undefined4 *)(local_1078 + (long)pRVar45 * 4);
                    local_1118 = *(undefined4 *)(local_1068 + (long)pRVar45 * 4);
                    local_1114 = *(undefined4 *)((long)&local_10d8 + (long)pRVar45 * 4);
                    local_1110 = uVar56;
                    local_110c = pRVar42->instID[0];
                    local_1108 = pRVar42->instPrimID[0];
                    (local_1238->super_RayK<1>).tfar = local_1058[(long)pRVar45];
                    local_120c._0_4_ = -NAN;
                    local_11e8.valid = (int *)local_120c;
                    local_11e8.geometryUserPtr = pGVar28->userPtr;
                    local_11e8.context = pRVar42;
                    local_11e8.ray = (RTCRayN *)local_1238;
                    local_11e8.hit = (RTCHitN *)&local_1128;
                    local_11e8.N = 1;
                    local_1228._0_8_ = pGVar28;
                    local_1268._0_8_ = pRVar45;
                    fVar67 = (float)local_1278._0_4_;
                    fVar125 = (float)local_1278._4_4_;
                    fVar155 = fStack_1270;
                    fVar149 = fStack_126c;
                    local_1258 = auVar122;
                    if (pGVar28->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00d0b632:
                      if ((((RTCIntersectArguments *)uVar48)->filter != (RTCFilterFunctionN)0x0) &&
                         (((((RTCIntersectArguments *)uVar48)->flags &
                           RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_1228._0_8_ + 0x3e) & 0x40) != 0)))) {
                        (*((RTCIntersectArguments *)uVar48)->filter)(&local_11e8);
                        pRVar45 = (RayHit *)local_1268._0_8_;
                        fVar67 = (float)local_1278._0_4_;
                        fVar125 = (float)local_1278._4_4_;
                        fVar155 = fStack_1270;
                        fVar149 = fStack_126c;
                        if ((((RayK<1> *)local_11e8.valid)->org).field_0.m128[0] == 0.0)
                        goto LAB_00d0b6cd;
                      }
                      (((Vec3f *)((long)local_11e8.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_11e8.hit;
                      (((Vec3f *)((long)local_11e8.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_11e8.hit + 4);
                      (((Vec3f *)((long)local_11e8.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_11e8.hit + 8);
                      *(float *)((long)local_11e8.ray + 0x3c) = *(float *)(local_11e8.hit + 0xc);
                      *(float *)((long)local_11e8.ray + 0x40) = *(float *)(local_11e8.hit + 0x10);
                      *(float *)((long)local_11e8.ray + 0x44) = *(float *)(local_11e8.hit + 0x14);
                      *(float *)((long)local_11e8.ray + 0x48) = *(float *)(local_11e8.hit + 0x18);
                      *(float *)((long)local_11e8.ray + 0x4c) = *(float *)(local_11e8.hit + 0x1c);
                      *(float *)((long)local_11e8.ray + 0x50) = *(float *)(local_11e8.hit + 0x20);
                      pRVar40 = (RayHit *)local_11e8.ray;
                    }
                    else {
                      unique0x10002c1c = uVar48;
                      (*pGVar28->intersectionFilterN)(&local_11e8);
                      pRVar45 = (RayHit *)local_1268._0_8_;
                      uVar48 = stack0xffffffffffffedf8;
                      fVar67 = (float)local_1278._0_4_;
                      fVar125 = (float)local_1278._4_4_;
                      fVar155 = fStack_1270;
                      fVar149 = fStack_126c;
                      if ((((RayK<1> *)local_11e8.valid)->org).field_0.m128[0] != 0.0)
                      goto LAB_00d0b632;
LAB_00d0b6cd:
                      (local_1238->super_RayK<1>).tfar = (float)local_1258._0_4_;
                      pRVar40 = (RayHit *)local_11e8.valid;
                      pRVar45 = (RayHit *)local_1268._0_8_;
                    }
                    uVar56 = (uint)pRVar40;
                    *(undefined4 *)(local_11f8 + (long)pRVar45 * 4) = 0;
                    auVar122._0_4_ = (local_1238->super_RayK<1>).tfar;
                    auVar122._4_4_ = (local_1238->super_RayK<1>).mask;
                    auVar122._8_4_ = (local_1238->super_RayK<1>).id;
                    auVar122._12_4_ = (local_1238->super_RayK<1>).flags;
                    local_11f8._0_4_ = -(uint)(fVar67 <= (float)auVar122._0_4_) & local_11f8._0_4_;
                    local_11f8._4_4_ = -(uint)(fVar125 <= (float)auVar122._0_4_) & local_11f8._4_4_;
                    local_11f8._8_4_ = -(uint)(fVar155 <= (float)auVar122._0_4_) & local_11f8._8_4_;
                    fStack_11ec = (float)(-(uint)(fVar149 <= (float)auVar122._0_4_) &
                                         (uint)fStack_11ec);
                    uVar55 = (local_1238->super_RayK<1>).mask;
                    local_1278._0_4_ = fVar67;
                    local_1278._4_4_ = fVar125;
                    fStack_1270 = fVar155;
                    fStack_126c = fVar149;
                  }
                  ray = (RayHit *)(ulong)uVar55;
                  iVar36 = movmskps(uVar56,_local_11f8);
                  if (iVar36 == 0) break;
                  local_1268._0_4_ = uVar55;
                  local_1258 = auVar122;
                  BVHNIntersector1<4,16777232,true,embree::sse2::ArrayIntersector1<embree::sse2::TriangleMiMBIntersector1Pluecker<4,true>>>
                  ::intersect();
                  pRVar45 = (RayHit *)local_11e8.valid;
                  auVar122 = local_1258;
                  uVar55 = local_1268._0_4_;
                } while( true );
              }
            }
            local_1138 = local_1138 + 1;
            pRVar45 = local_1238;
          } while (local_1138 != local_1140);
        }
        fVar74 = (pRVar45->super_RayK<1>).tfar;
        auVar132._4_4_ = fVar74;
        auVar132._0_4_ = fVar74;
        auVar132._8_4_ = fVar74;
        auVar132._12_4_ = fVar74;
        uVar39 = local_1248;
        uVar50 = local_1240;
        auVar101 = local_fc8;
        fVar87 = local_ff8;
        fVar93 = fStack_ff4;
        fVar94 = fStack_ff0;
        fVar125 = fStack_fec;
        fVar95 = local_1008;
        fVar96 = fStack_1004;
        fVar97 = fStack_1000;
        fVar155 = fStack_ffc;
        fVar98 = local_1018;
        fVar99 = fStack_1014;
        fVar100 = fStack_1010;
        fVar148 = fStack_100c;
        fVar151 = local_10e8;
        fVar67 = fStack_10e4;
        fVar75 = fStack_10e0;
        fVar143 = fStack_10dc;
        fVar140 = local_10f8;
        fVar79 = fStack_10f4;
        fVar85 = fStack_10f0;
        fVar86 = fStack_10ec;
        fVar110 = local_fb8;
        fVar111 = fStack_fb4;
        fVar112 = fStack_fb0;
        fVar149 = fStack_fac;
        fVar113 = local_fd8;
        fVar114 = fStack_fd4;
        fVar118 = fStack_fd0;
        fVar145 = fStack_fcc;
        fVar123 = local_fe8;
        fVar124 = fStack_fe4;
        fVar126 = fStack_fe0;
        fVar153 = fStack_fdc;
      }
    } while (pauVar38 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }